

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneDiffer.cpp
# Opt level: O1

string * __thiscall
Assimp::dumpFace_abi_cxx11_(string *__return_storage_ptr__,Assimp *this,aiFace *face)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  stringstream stream;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  if (*(int *)this != 0) {
    uVar2 = 0;
    do {
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      bVar3 = uVar2 < *(int *)this - 1;
      pcVar1 = "\n";
      if (bVar3) {
        pcVar1 = ", ";
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar1,(ulong)bVar3 + 1);
      uVar2 = uVar2 + 1;
    } while (uVar2 < *(uint *)this);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

static std::string dumpFace( const aiFace &face ) {
    std::stringstream stream;
    for ( unsigned int i = 0; i < face.mNumIndices; i++ ) {
        stream << face.mIndices[ i ];
        if ( i < face.mNumIndices - 1 ) {
            stream << ", ";
        }
        else {
            stream << "\n";
        }
    }
    return stream.str();
}